

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O1

void __thiscall
cfdcapi_common_CfdCreateSimpleHandle_Test::~cfdcapi_common_CfdCreateSimpleHandle_Test
          (cfdcapi_common_CfdCreateSimpleHandle_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(cfdcapi_common, CfdCreateSimpleHandle) {
  int ret = CfdCreateSimpleHandle(NULL);
  EXPECT_EQ(kCfdIllegalArgumentError, ret);

  void* handle = NULL;
  ret = CfdCreateSimpleHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}